

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

int vrf_part(part_t *part,int mode)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  
  lVar1 = tdefs[0].vtotal + part->partkey;
  cVar3 = part->name[0];
  if (cVar3 != '\0') {
    pcVar2 = part->name;
    do {
      pcVar2 = pcVar2 + 1;
      lVar1 = lVar1 + cVar3;
      cVar3 = *pcVar2;
    } while (cVar3 != '\0');
  }
  cVar3 = part->mfgr[0];
  if (cVar3 != '\0') {
    pcVar2 = part->mfgr;
    do {
      pcVar2 = pcVar2 + 1;
      lVar1 = lVar1 + cVar3;
      cVar3 = *pcVar2;
    } while (cVar3 != '\0');
  }
  cVar3 = part->brand[0];
  if (cVar3 != '\0') {
    pcVar2 = part->brand;
    do {
      pcVar2 = pcVar2 + 1;
      lVar1 = lVar1 + cVar3;
      cVar3 = *pcVar2;
    } while (cVar3 != '\0');
  }
  cVar3 = part->type[0];
  if (cVar3 != '\0') {
    pcVar2 = part->type;
    do {
      pcVar2 = pcVar2 + 1;
      lVar1 = lVar1 + cVar3;
      cVar3 = *pcVar2;
    } while (cVar3 != '\0');
  }
  tdefs[0].vtotal = lVar1 + part->size;
  cVar3 = part->container[0];
  if (cVar3 != '\0') {
    pcVar2 = part->container;
    do {
      pcVar2 = pcVar2 + 1;
      tdefs[0].vtotal = tdefs[0].vtotal + (long)cVar3;
      cVar3 = *pcVar2;
    } while (cVar3 != '\0');
  }
  cVar3 = part->category[0];
  if (cVar3 != '\0') {
    pcVar2 = part->category;
    do {
      pcVar2 = pcVar2 + 1;
      tdefs[0].vtotal = tdefs[0].vtotal + (long)cVar3;
      cVar3 = *pcVar2;
    } while (cVar3 != '\0');
  }
  return 0;
}

Assistant:

int
vrf_part(part_t *part, int mode)
{

    UNUSED(mode);
    VRF_STRT(PART);
    VRF_INT(PART, part->partkey);
    VRF_STR(PART, part->name);
    VRF_STR(PART, part->mfgr);
    VRF_STR(PART, part->brand);
    VRF_STR(PART, part->type);
    VRF_INT(PART, part->size);
    VRF_STR(PART, part->container);
    VRF_STR(PART, part->category);
    VRF_END(PART);

    return(0);
}